

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool CheckWitnessMalleation
               (CBlock *block,bool expect_witness_commitment,BlockValidationState *state)

{
  Span<const_unsigned_char> input;
  Span<const_unsigned_char> input_00;
  Span<unsigned_char> output;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  allocator<char> *__a;
  CHash256 *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  uchar *__s2;
  char *in_RDX;
  byte in_SIL;
  long in_RDI;
  long in_FS_OFFSET;
  shared_ptr<const_CTransaction> *tx;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range1;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *witness_stack;
  int commitpos;
  const_iterator __end1;
  const_iterator __begin1;
  uint256 hash_witness;
  CTransaction *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  size_type in_stack_fffffffffffffda4;
  undefined6 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdae;
  undefined1 in_stack_fffffffffffffdaf;
  undefined4 in_stack_fffffffffffffdb0;
  BlockValidationResult in_stack_fffffffffffffdb4;
  BlockValidationResult result;
  CBlock *in_stack_fffffffffffffdb8;
  ValidationState<BlockValidationResult> *this_00;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  char *in_stack_fffffffffffffdc8;
  allocator<char> *in_stack_fffffffffffffdd8;
  char *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  CBlock *in_stack_fffffffffffffdf8;
  byte local_1f1;
  bool local_1a2;
  undefined1 local_1a1 [9];
  shared_ptr<const_CTransaction> *local_198;
  allocator<char> local_189 [56];
  allocator<char> local_151 [129];
  undefined1 local_d0 [200];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_SIL & 1) != 0) {
    if ((*(byte *)(in_RDI + 0x69) & 1) != 0) {
      local_1a2 = true;
      goto LAB_007e0eaf;
    }
    iVar2 = GetWitnessCommitmentIndex(in_stack_fffffffffffffdb8);
    if (iVar2 != -1) {
      bVar1 = std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::empty((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       *)CONCAT17(in_stack_fffffffffffffdaf,
                                  CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)));
      local_1f1 = 0;
      if (!bVar1) {
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)CONCAT17(in_stack_fffffffffffffdaf,
                                 CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)),
                     CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)in_stack_fffffffffffffd98);
        bVar1 = std::vector<CTxIn,_std::allocator<CTxIn>_>::empty
                          ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                           CONCAT17(in_stack_fffffffffffffdaf,
                                    CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)));
        local_1f1 = bVar1 ^ 0xff;
      }
      if ((local_1f1 & 1) == 0) {
        __assert_fail("!block.vtx.empty() && !block.vtx[0]->vin.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0xf6d,
                      "bool CheckWitnessMalleation(const CBlock &, bool, BlockValidationState &)");
      }
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)CONCAT17(in_stack_fffffffffffffdaf,
                               CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)),
                   CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffd98);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                 CONCAT17(in_stack_fffffffffffffdaf,
                          CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)),
                 CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
      sVar3 = std::
              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)in_stack_fffffffffffffd98);
      if (sVar3 == 1) {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffdaf,
                                 CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)),
                     CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
        sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffffd98);
        if (sVar3 == 0x20) {
          BlockWitnessMerkleRoot
                    (in_stack_fffffffffffffdf8,
                     (bool *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
          memset(local_d0,0,0x68);
          CHash256::CHash256((CHash256 *)in_stack_fffffffffffffd98);
          Span<const_unsigned_char>::Span<uint256>
                    ((Span<const_unsigned_char> *)
                     CONCAT17(in_stack_fffffffffffffdaf,
                              CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)),
                     (uint256 *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     in_stack_fffffffffffffd98);
          input.m_data._4_4_ = in_stack_fffffffffffffdb4;
          input.m_data._0_4_ = in_stack_fffffffffffffdb0;
          input.m_size = (size_t)in_stack_fffffffffffffdb8;
          __a = (allocator<char> *)
                CHash256::Write((CHash256 *)
                                CONCAT17(in_stack_fffffffffffffdaf,
                                         CONCAT16(in_stack_fffffffffffffdae,
                                                  in_stack_fffffffffffffda8)),input);
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffdaf,
                                   CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)),
                       CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
          Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((Span<const_unsigned_char> *)
                     CONCAT17(in_stack_fffffffffffffdaf,
                              CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)),
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     in_stack_fffffffffffffd98);
          input_00.m_data._4_4_ = in_stack_fffffffffffffdb4;
          input_00.m_data._0_4_ = in_stack_fffffffffffffdb0;
          input_00.m_size = (size_t)in_stack_fffffffffffffdb8;
          __s = CHash256::Write((CHash256 *)
                                CONCAT17(in_stack_fffffffffffffdaf,
                                         CONCAT16(in_stack_fffffffffffffdae,
                                                  in_stack_fffffffffffffda8)),input_00);
          Span<unsigned_char>::Span<uint256>
                    ((Span<unsigned_char> *)
                     CONCAT17(in_stack_fffffffffffffdaf,
                              CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)),
                     (uint256 *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     in_stack_fffffffffffffd98);
          output.m_data._4_4_ = in_stack_fffffffffffffdb4;
          output.m_data._0_4_ = in_stack_fffffffffffffdb0;
          output.m_size = (size_t)in_stack_fffffffffffffdb8;
          CHash256::Finalize((CHash256 *)
                             CONCAT17(in_stack_fffffffffffffdaf,
                                      CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8))
                             ,output);
          this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 base_blob<256U>::begin((base_blob<256U> *)in_stack_fffffffffffffd98);
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        *)CONCAT17(in_stack_fffffffffffffdaf,
                                   CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)),
                       CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
          std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_stack_fffffffffffffd98);
          std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                     CONCAT17(in_stack_fffffffffffffdaf,
                              CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)),
                     CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
          __s2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                           ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                            CONCAT17(in_stack_fffffffffffffdaf,
                                     CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)),
                            in_stack_fffffffffffffda4);
          iVar2 = memcmp(this,__s2,0x20);
          if (iVar2 == 0) {
            *(undefined1 *)(in_RDI + 0x69) = 1;
            local_1a2 = true;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
            tinyformat::format<char[23]>
                      (in_RDX,(char (*) [23])
                              CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
            local_1a2 = ValidationState<BlockValidationResult>::Invalid
                                  ((ValidationState<BlockValidationResult> *)
                                   in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb4,
                                   (string *)
                                   CONCAT17(in_stack_fffffffffffffdaf,
                                            CONCAT16(in_stack_fffffffffffffdae,
                                                     in_stack_fffffffffffffda8)),
                                   (string *)
                                   CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd98);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd98);
            std::allocator<char>::~allocator(local_189);
          }
          goto LAB_007e0eaf;
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      tinyformat::format<char[23]>
                (in_stack_fffffffffffffdc8,
                 (char (*) [23])CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
      local_1a2 = ValidationState<BlockValidationResult>::Invalid
                            ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffffdb8,
                             in_stack_fffffffffffffdb4,
                             (string *)
                             CONCAT17(in_stack_fffffffffffffdaf,
                                      CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8))
                             ,(string *)
                              CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd98);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd98);
      std::allocator<char>::~allocator(local_151);
      goto LAB_007e0eaf;
    }
  }
  local_198 = (shared_ptr<const_CTransaction> *)
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  local_1a1._1_8_ =
       std::
       vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                           ((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffdaf,
                                        CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8
                                                )),
                            (__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator*((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                 *)in_stack_fffffffffffffd98);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffd98);
    bVar1 = CTransaction::HasWitness(in_stack_fffffffffffffd98);
    if (bVar1) {
      result = (BlockValidationResult)((ulong)in_RDX >> 0x20);
      this_00 = (ValidationState<BlockValidationResult> *)local_1a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      tinyformat::format<char[23]>
                (in_stack_fffffffffffffdc8,
                 (char (*) [23])CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
      local_1a2 = ValidationState<BlockValidationResult>::Invalid
                            (this_00,result,
                             (string *)
                             CONCAT17(in_stack_fffffffffffffdaf,
                                      CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8))
                             ,(string *)
                              CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd98);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd98);
      std::allocator<char>::~allocator((allocator<char> *)local_1a1);
      goto LAB_007e0eaf;
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator++((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                  *)in_stack_fffffffffffffd98);
  }
  local_1a2 = true;
LAB_007e0eaf:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_1a2;
}

Assistant:

static bool CheckWitnessMalleation(const CBlock& block, bool expect_witness_commitment, BlockValidationState& state)
{
    if (expect_witness_commitment) {
        if (block.m_checked_witness_commitment) return true;

        int commitpos = GetWitnessCommitmentIndex(block);
        if (commitpos != NO_WITNESS_COMMITMENT) {
            assert(!block.vtx.empty() && !block.vtx[0]->vin.empty());
            const auto& witness_stack{block.vtx[0]->vin[0].scriptWitness.stack};

            if (witness_stack.size() != 1 || witness_stack[0].size() != 32) {
                return state.Invalid(
                    /*result=*/BlockValidationResult::BLOCK_MUTATED,
                    /*reject_reason=*/"bad-witness-nonce-size",
                    /*debug_message=*/strprintf("%s : invalid witness reserved value size", __func__));
            }

            // The malleation check is ignored; as the transaction tree itself
            // already does not permit it, it is impossible to trigger in the
            // witness tree.
            uint256 hash_witness = BlockWitnessMerkleRoot(block, /*mutated=*/nullptr);

            CHash256().Write(hash_witness).Write(witness_stack[0]).Finalize(hash_witness);
            if (memcmp(hash_witness.begin(), &block.vtx[0]->vout[commitpos].scriptPubKey[6], 32)) {
                return state.Invalid(
                    /*result=*/BlockValidationResult::BLOCK_MUTATED,
                    /*reject_reason=*/"bad-witness-merkle-match",
                    /*debug_message=*/strprintf("%s : witness merkle commitment mismatch", __func__));
            }

            block.m_checked_witness_commitment = true;
            return true;
        }
    }

    // No witness data is allowed in blocks that don't commit to witness data, as this would otherwise leave room for spam
    for (const auto& tx : block.vtx) {
        if (tx->HasWitness()) {
            return state.Invalid(
                /*result=*/BlockValidationResult::BLOCK_MUTATED,
                /*reject_reason=*/"unexpected-witness",
                /*debug_message=*/strprintf("%s : unexpected witness data found", __func__));
        }
    }

    return true;
}